

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::a_formatter<spdlog::details::null_scoped_padder>::format
          (a_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  reference ppcVar1;
  size_t sVar2;
  memory_buf_t *in_RCX;
  array<const_char_*,_7UL> *in_RDI;
  null_scoped_padder p;
  string_view_t field_value;
  size_type in_stack_ffffffffffffff98;
  undefined1 *puVar3;
  char *in_stack_ffffffffffffffb8;
  value_type pcVar4;
  memory_buf_t *local_38;
  
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](in_RDI,in_stack_ffffffffffffff98);
  pcVar4 = *ppcVar1;
  puVar3 = &stack0xffffffffffffffc0;
  sVar2 = std::char_traits<char>::length((char_type *)0x2e23d4);
  *(size_t *)(puVar3 + 8) = sVar2;
  sVar2 = fmt::v10::basic_string_view<char>::size
                    ((basic_string_view<char> *)&stack0xffffffffffffffc0);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffbf,sVar2,
             (padding_info *)(in_RDI->_M_elems + 1),in_RCX);
  view.size_ = (size_t)pcVar4;
  view.data_ = in_stack_ffffffffffffffb8;
  fmt_helper::append_string_view(view,local_38);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }